

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::FastPForImpl<8U,_unsigned_long>::decodeArray
          (FastPForImpl<8U,_unsigned_long> *this,uint32_t *in,size_t length,unsigned_long *out,
          size_t *nvalue)

{
  undefined8 uVar1;
  ulong uVar2;
  logic_error *this_00;
  ulong in_RCX;
  long in_RDX;
  uint *in_RSI;
  uint *in_RDI;
  ulong *in_R8;
  size_t thissize;
  size_t thisnvalue;
  unsigned_long *finalout;
  size_t mynvalue;
  uint32_t *initin;
  size_t in_stack_00000230;
  unsigned_long *in_stack_00000238;
  size_t *in_stack_00000240;
  uint32_t *in_stack_00000248;
  FastPForImpl<8U,_unsigned_long> *in_stack_00000250;
  size_t in_stack_ffffffffffffff78;
  NotEnoughStorage *in_stack_ffffffffffffff80;
  FastPForImpl<8U,_unsigned_long> *local_78;
  FastPForImpl<8U,_unsigned_long> *in_stack_ffffffffffffffa0;
  ulong local_20;
  
  if (*in_R8 < (ulong)*in_RSI) {
    uVar1 = __cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    __cxa_throw(uVar1,&NotEnoughStorage::typeinfo,NotEnoughStorage::~NotEnoughStorage);
  }
  *in_R8 = (ulong)*in_RSI;
  uVar2 = in_RCX + *in_R8 * 8;
  for (local_20 = in_RCX; local_20 != uVar2; local_20 = (long)local_78 * 8 + local_20) {
    if (local_20 + (ulong)*in_RDI * 8 < uVar2) {
      local_78 = (FastPForImpl<8U,_unsigned_long> *)(ulong)*in_RDI;
    }
    else {
      local_78 = (FastPForImpl<8U,_unsigned_long> *)((long)(uVar2 - local_20) >> 3);
    }
    __decodeArray(in_stack_00000250,in_stack_00000248,in_stack_00000240,in_stack_00000238,
                  in_stack_00000230);
    in_stack_ffffffffffffffa0 = local_78;
  }
  if (in_RSI + in_RDX < in_RSI + 1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"Decode run over output buffer. Potential buffer overflow!");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  resetBuffer(in_stack_ffffffffffffffa0);
  return in_RSI + 1;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t length,
                              IntType *out, size_t &nvalue) {
    const uint32_t *const initin(in);
    const size_t mynvalue = *in;
    ++in;
    if (mynvalue > nvalue) throw NotEnoughStorage(mynvalue);
    nvalue = mynvalue;
    const IntType *const finalout(out + nvalue);
    while (out != finalout) {
      size_t thisnvalue(0);
      size_t thissize = static_cast<size_t>(
          finalout > PageSize + out ? PageSize : (finalout - out));

      __decodeArray(in, thisnvalue, out, thissize);
      in += thisnvalue;
      out += thissize;
    }

    if (initin + length < in) {
      throw std::logic_error(
          "Decode run over output buffer. Potential buffer overflow!");
    }

    resetBuffer();  // if you don't do this, the codec has a "memory".
    return in;
  }